

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2NeverCapture(void)

{
  int iVar1;
  RE2 re;
  Options local_280;
  RE2 local_268;
  LogMessageFatal local_188;
  
  local_280.encoding_ = EncodingUTF8;
  local_280.posix_syntax_ = false;
  local_280.longest_match_ = false;
  local_280.log_errors_ = true;
  local_280.max_mem_ = 0x800000;
  local_280.literal_ = false;
  local_280.never_nl_ = false;
  local_280.dot_nl_ = false;
  local_280.never_capture_ = true;
  local_280.case_sensitive_ = true;
  local_280.perl_classes_ = false;
  local_280.word_boundary_ = false;
  local_280.one_line_ = false;
  local_188.super_LogMessage._0_8_ = "(r)(e)";
  local_188.super_LogMessage._8_4_ = 6;
  RE2::RE2(&local_268,(StringPiece *)&local_188,&local_280);
  iVar1 = RE2::NumberOfCapturingGroups(&local_268);
  if (iVar1 != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x53d);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,
                    "Check failed: (0) == (re.NumberOfCapturingGroups())");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  RE2::~RE2(&local_268);
  return;
}

Assistant:

TEST(RE2, NeverCapture) {
  RE2::Options opt;
  opt.set_never_capture(true);
  RE2 re("(r)(e)", opt);
  EXPECT_EQ(0, re.NumberOfCapturingGroups());
}